

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O2

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int _h;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  undefined4 unaff_EBP;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  int _d;
  byte bVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  Mat local_a8;
  Mat *local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  Option *local_38;
  
  uVar1 = bottom_blob->dims;
  local_48 = (this->axes).data;
  if ((local_48 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    auVar15._0_4_ = -(uint)(this->expand_w == 0);
    auVar15._4_4_ = -(uint)(this->expand_h == 0);
    auVar15._8_4_ = -(uint)(this->expand_d == 0);
    auVar15._12_4_ = -(uint)(this->expand_c == 0);
    uVar7 = movmskps(unaff_EBP,auVar15);
    uVar8 = uVar7 ^ 0xf;
    bVar11 = (byte)uVar8;
    bVar10 = (bVar11 & 2) >> 1;
    bVar6 = (bVar11 & 4) >> 2;
    local_58 = (ulong)CONCAT31((int3)(uVar7 >> 8),bVar11 >> 3);
  }
  else {
    uVar7 = (this->axes).w;
    local_3c = uVar1 + 1;
    local_40 = uVar1 & 0xfffffffe;
    uVar9 = 0;
    local_50 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      local_50 = uVar9;
    }
    uVar8 = 0;
    bVar10 = 0;
    bVar6 = 0;
    local_58 = 0;
    for (; local_38 = opt, local_50 != uVar9; uVar9 = uVar9 + 1) {
      bVar13 = uVar1 == 3;
      iVar12 = *(int *)((long)local_48 + uVar9 * 4);
      iVar12 = (iVar12 >> 0x1f & local_3c) + iVar12;
      bVar14 = iVar12 == 1;
      local_58 = (ulong)(byte)((byte)local_58 | (local_40 == 2 && iVar12 == 0));
      bVar6 = bVar6 | (bVar14 && bVar13);
      bVar10 = (uVar1 == 1 && iVar12 == 0) | bVar10 |
               (iVar12 == 2 && bVar13 || uVar1 == 2 && bVar14);
      uVar8 = (uint)(byte)((uVar1 == 1 && bVar14) | (byte)uVar8 |
                          (iVar12 == 3 && bVar13 || uVar1 == 2 && iVar12 == 2));
    }
  }
  iVar12 = bottom_blob->w;
  _h = bottom_blob->h;
  _d = bottom_blob->c;
  local_60 = bottom_blob;
  if (top_blob != bottom_blob) {
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        local_50 = CONCAT44(local_50._4_4_,_d);
        uVar9 = (ulong)local_48 >> 0x20;
        local_48 = (void *)CONCAT44((int)uVar9,iVar12);
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
        iVar12 = (int)local_48;
        _d = (int)local_50;
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar2 = local_60->refcount;
    top_blob->data = local_60->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = local_60->elemsize;
    top_blob->elempack = local_60->elempack;
    top_blob->allocator = local_60->allocator;
    iVar3 = local_60->w;
    iVar4 = local_60->h;
    iVar5 = local_60->d;
    top_blob->dims = local_60->dims;
    top_blob->w = iVar3;
    top_blob->h = iVar4;
    top_blob->d = iVar5;
    top_blob->c = local_60->c;
    top_blob->cstep = local_60->cstep;
  }
  if (uVar1 == 3) {
    if ((uVar8 & 1) == 0) {
      if (bVar10 == 0) {
        if (bVar6 == 0) {
          if ((local_58 & 1) == 0) goto LAB_003c8d32;
          Mat::reshape(&local_a8,local_60,iVar12,_h,_d,1,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto LAB_003c8d32;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto LAB_003c8d32;
          }
        }
        else {
          Mat::reshape(&local_a8,local_60,iVar12,_h,1,_d,opt->blob_allocator);
          if (&local_a8 != top_blob) {
            if (local_a8.refcount != (int *)0x0) {
              LOCK();
              *local_a8.refcount = *local_a8.refcount + 1;
              UNLOCK();
            }
            piVar2 = top_blob->refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a8.data;
            top_blob->refcount = local_a8.refcount;
            top_blob->elemsize = local_a8.elemsize;
            top_blob->elempack = local_a8.elempack;
            top_blob->allocator = local_a8.allocator;
            top_blob->dims = local_a8.dims;
            top_blob->w = local_a8.w;
            top_blob->h = local_a8.h;
            top_blob->d = local_a8.d;
            top_blob->c = local_a8.c;
            top_blob->cstep = local_a8.cstep;
          }
          if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
          LOCK();
          *local_a8.refcount = *local_a8.refcount + -1;
          UNLOCK();
          if (*local_a8.refcount != 0) goto LAB_003c8d32;
          if (local_a8.allocator != (Allocator *)0x0) {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
            goto LAB_003c8d32;
          }
        }
      }
      else {
        Mat::reshape(&local_a8,local_60,iVar12,1,_h,_d,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_003c8d32;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_003c8d32;
        }
      }
    }
    else {
      Mat::reshape(&local_a8,local_60,1,iVar12,_h,_d,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto LAB_003c8d32;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto LAB_003c8d32;
      }
    }
  }
  else if (uVar1 == 2) {
    if ((uVar8 & 1) == 0) {
      if (bVar10 == 0) {
        if ((local_58 & 1) == 0) goto LAB_003c8d32;
        Mat::reshape(&local_a8,local_60,iVar12,_h,1,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_003c8d32;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_003c8d32;
        }
      }
      else {
        Mat::reshape(&local_a8,local_60,iVar12,1,_h,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_003c8d32;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_003c8d32;
        }
      }
    }
    else {
      Mat::reshape(&local_a8,local_60,1,iVar12,_h,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto LAB_003c8d32;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto LAB_003c8d32;
      }
    }
  }
  else {
    if (uVar1 != 1) goto LAB_003c8d32;
    if (((byte)uVar8 & bVar10) == 0) {
      if ((uVar8 & 1) == 0) {
        if (bVar10 == 0) goto LAB_003c8d32;
        Mat::reshape(&local_a8,local_60,iVar12,1,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_003c8d32;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_003c8d32;
        }
      }
      else {
        Mat::reshape(&local_a8,local_60,1,iVar12,opt->blob_allocator);
        if (&local_a8 != top_blob) {
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a8.data;
          top_blob->refcount = local_a8.refcount;
          top_blob->elemsize = local_a8.elemsize;
          top_blob->elempack = local_a8.elempack;
          top_blob->allocator = local_a8.allocator;
          top_blob->dims = local_a8.dims;
          top_blob->w = local_a8.w;
          top_blob->h = local_a8.h;
          top_blob->d = local_a8.d;
          top_blob->c = local_a8.c;
          top_blob->cstep = local_a8.cstep;
        }
        if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
        LOCK();
        *local_a8.refcount = *local_a8.refcount + -1;
        UNLOCK();
        if (*local_a8.refcount != 0) goto LAB_003c8d32;
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          goto LAB_003c8d32;
        }
      }
    }
    else {
      Mat::reshape(&local_a8,local_60,1,iVar12,1,opt->blob_allocator);
      if (&local_a8 != top_blob) {
        if (local_a8.refcount != (int *)0x0) {
          LOCK();
          *local_a8.refcount = *local_a8.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a8.data;
        top_blob->refcount = local_a8.refcount;
        top_blob->elemsize = local_a8.elemsize;
        top_blob->elempack = local_a8.elempack;
        top_blob->allocator = local_a8.allocator;
        top_blob->dims = local_a8.dims;
        top_blob->w = local_a8.w;
        top_blob->h = local_a8.h;
        top_blob->d = local_a8.d;
        top_blob->c = local_a8.c;
        top_blob->cstep = local_a8.cstep;
      }
      if (local_a8.refcount == (int *)0x0) goto LAB_003c8d32;
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount != 0) goto LAB_003c8d32;
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        goto LAB_003c8d32;
      }
    }
  }
  free(local_a8.data);
LAB_003c8d32:
  if ((top_blob->data == (void *)0x0) || (iVar12 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar12 = -100;
  }
  return iVar12;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_d = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_d = expand_d;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
            if (dims == 3 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 3 && axis == 1)
            {
                _expand_d = true;
            }
            if (dims == 3 && axis == 2)
            {
                _expand_h = true;
            }
            if (dims == 3 && axis == 3)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, channels, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, channels, opt.blob_allocator);
        }
        else if (_expand_d)
        {
            top_blob = bottom_blob.reshape(w, h, 1, channels, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, channels, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}